

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall soplex::SPxSteepPR<double>::selectEnter(SPxSteepPR<double> *this)

{
  SPxOut *pSVar1;
  SPxSolverBase<double> *pSVar2;
  SVectorBase<double> *rhs;
  SSVectorBase<double> *x;
  double dVar3;
  SPxId enterId;
  Verbosity old_verbosity;
  DataKey local_28;
  undefined4 local_20;
  Verbosity local_1c;
  
  local_28.info = 0;
  local_28.idx = -1;
  local_28 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance);
  if ((local_28.info == 0) && (this->refined == false)) {
    this->refined = true;
    pSVar1 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      local_20 = 5;
      local_1c = pSVar1->m_verbosity;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"WSTEEP05 trying refinement step..\n",0x22);
      pSVar1 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_1c);
    }
    local_28 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance * 0.5);
  }
  if (local_28.info != 0) {
    pSVar2 = (this->super_SPxPricer<double>).thesolver;
    x = &pSVar2->theFvec->thedelta;
    rhs = SPxSolverBase<double>::vector(pSVar2,(SPxId *)&local_28);
    SPxBasisBase<double>::solve4update(&pSVar2->super_SPxBasisBase<double>,x,rhs);
    SSVectorBase<double>::setup_and_assign<double>(&this->workRhs,x);
    dVar3 = SSVectorBase<double>::length2(x);
    this->pi_p = dVar3 + 1.0;
    pSVar2 = (this->super_SPxPricer<double>).thesolver;
    pSVar2->coSolveVector2 = &this->workVec;
    pSVar2->coSolveVector2rhs = &this->workRhs;
  }
  return (SPxId)local_28;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}